

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,FamilyType v)

{
  char *pcVar1;
  int iVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar1 = "unrestricted";
  }
  else if (iVar2 == 1) {
    pcVar1 = "nonOverlapping";
  }
  else {
    if (iVar2 != 0) {
      return __return_storage_ptr__;
    }
    pcVar1 = "partition";
  }
  ::std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::GeomSubset::FamilyType v) {
  std::string s;

  switch (v) {
    case tinyusdz::GeomSubset::FamilyType::Partition: {
      s = "partition";
      break;
    }
    case tinyusdz::GeomSubset::FamilyType::NonOverlapping: {
      s = "nonOverlapping";
      break;
    }
    case tinyusdz::GeomSubset::FamilyType::Unrestricted: {
      s = "unrestricted";
      break;
    }
  }

  return s;
}